

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

void __thiscall duckdb::ChangeColumnTypeInfo::ChangeColumnTypeInfo(ChangeColumnTypeInfo *this)

{
  AlterTableInfo::AlterTableInfo(&this->super_AlterTableInfo,ALTER_COLUMN_TYPE);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__ChangeColumnTypeInfo_027925a8;
  (this->column_name)._M_dataplus._M_p = (pointer)&(this->column_name).field_2;
  (this->column_name)._M_string_length = 0;
  (this->column_name).field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&this->target_type);
  (this->expression).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  return;
}

Assistant:

ChangeColumnTypeInfo::ChangeColumnTypeInfo() : AlterTableInfo(AlterTableType::ALTER_COLUMN_TYPE) {
}